

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Cluster::ParseBlockGroup(Cluster *this,longlong payload_size,longlong *pos,long *len)

{
  IMkvReader *pReader;
  long lVar1;
  Cluster *pCVar2;
  int iVar3;
  longlong lVar4;
  long lVar5;
  longlong lVar6;
  ulong size;
  long lVar7;
  long lVar8;
  long lVar9;
  long lStack_70;
  uchar flags;
  longlong avail;
  longlong discard_padding;
  longlong local_50;
  Cluster *local_48;
  longlong local_40;
  longlong total;
  
  lVar5 = *pos;
  pReader = this->m_pSegment->m_pReader;
  iVar3 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&avail);
  if (iVar3 < 0) {
    lStack_70 = (long)iVar3;
  }
  else {
    if (total < avail && -1 < total) {
      __assert_fail("(total < 0) || (avail <= total)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x19a4,
                    "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)");
    }
    lVar9 = lVar5 + payload_size;
    if (total < 0 || lVar9 <= total) {
      if (lVar9 <= avail) {
        discard_padding = 0;
        local_50 = payload_size;
        local_48 = this;
        local_40 = lVar5;
LAB_00114bdf:
        pCVar2 = local_48;
        lVar5 = *pos;
        if (lVar9 <= lVar5) {
          if (lVar5 != lVar9) {
            return -2;
          }
          lVar5 = CreateBlock(local_48,0xa0,local_40,local_50,discard_padding);
          if (lVar5 != 0) {
            return lVar5;
          }
          pCVar2->m_pos = lVar9;
          return 0;
        }
        if (lVar5 < avail) {
          lVar4 = GetUIntLength(pReader,lVar5,len);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (lVar4 != 0) goto LAB_00114bb6;
          lVar5 = *len + *pos;
          if (lVar9 < lVar5) goto LAB_00114ba5;
          if (avail < lVar5) goto LAB_00114bb6;
          lVar4 = ReadID(pReader,*pos,len);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (lVar4 == 0) goto LAB_00114ba5;
          lVar5 = *pos + *len;
          *pos = lVar5;
          if (avail <= lVar5) goto LAB_00114e22;
          lVar6 = GetUIntLength(pReader,lVar5,len);
          if (lVar6 < 0) {
            return lVar6;
          }
          if (lVar6 != 0) goto LAB_00114bb6;
          lVar5 = *len + *pos;
          if (lVar9 < lVar5) goto LAB_00114ba5;
          if (avail < lVar5) goto LAB_00114bb6;
          size = ReadUInt(pReader,*pos,len);
          if ((long)size < 0) {
            return size;
          }
          lVar5 = *len;
          lVar6 = *pos + lVar5;
          *pos = lVar6;
          if (lVar9 < lVar6) goto LAB_00114ba5;
          if (size == 0) goto LAB_00114bdf;
          if ((-1L << ((char)lVar5 * '\a' & 0x3fU) ^ size) == 0xffffffffffffffff) goto LAB_00114ba5;
          if (lVar4 != 0xa1) {
            if (lVar4 == 0x75a2) {
              lVar5 = UnserializeInt(pReader,lVar6,size,&discard_padding);
              if (lVar5 < 0) {
                return lVar5;
              }
              lVar6 = *pos;
            }
            *pos = lVar6 + size;
            if (lVar9 < (long)(lVar6 + size)) goto LAB_00114ba5;
            goto LAB_00114bdf;
          }
          lVar5 = size + lVar6;
          if (lVar9 < lVar5) goto LAB_00114ba5;
          if (avail <= lVar6) goto LAB_00114e22;
          lVar4 = GetUIntLength(pReader,lVar6,len);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (lVar4 != 0) goto LAB_00114bb6;
          lVar7 = *len + *pos;
          if (lVar5 < lVar7) goto LAB_00114ba5;
          if (avail < lVar7) goto LAB_00114bb6;
          lVar4 = ReadUInt(pReader,*pos,len);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (lVar4 == 0) goto LAB_00114ba5;
          lVar8 = *len;
          lVar1 = *pos;
          lVar7 = lVar1 + lVar8;
          *pos = lVar7;
          lVar8 = lVar1 + lVar8 + 2;
          if (lVar5 < lVar8) goto LAB_00114ba5;
          if (avail < lVar8) {
            *len = 2;
            goto LAB_00114bb6;
          }
          *pos = lVar8;
          lVar7 = lVar7 + 3;
          if (lVar5 < lVar7) goto LAB_00114ba5;
          if (lVar7 <= avail) {
            lVar7 = 1;
            iVar3 = (**pReader->_vptr_IMkvReader)(pReader,lVar8,1,&flags);
            if (iVar3 < 0) {
              lVar5 = (long)iVar3;
            }
            else {
              lVar7 = *pos;
              lVar8 = lVar7 + 1;
              *pos = lVar8;
              if (avail <= lVar7) {
                __assert_fail("pos <= avail",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x1a49,
                              "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)"
                             );
              }
              lVar7 = lVar5 - lVar8;
              if (lVar7 == 0 || lVar5 < lVar8) goto LAB_00114ba5;
              if ((lVar5 <= avail) || ((flags & 6) == 0)) {
                *pos = lVar5;
                goto LAB_00114bdf;
              }
              lVar5 = -3;
            }
            *len = lVar7;
            return lVar5;
          }
        }
LAB_00114e22:
        *len = 1;
        goto LAB_00114bb6;
      }
      *len = payload_size;
LAB_00114bb6:
      lStack_70 = -3;
    }
    else {
LAB_00114ba5:
      lStack_70 = -2;
    }
  }
  return lStack_70;
}

Assistant:

long Cluster::ParseBlockGroup(long long payload_size, long long& pos,
                              long& len) {
  const long long payload_start = pos;
  const long long payload_stop = pos + payload_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  if ((total >= 0) && (payload_stop > total))
    return E_FILE_FORMAT_INVALID;

  if (payload_stop > avail) {
    len = static_cast<long>(payload_size);
    return E_BUFFER_NOT_FULL;
  }

  long long discard_padding = 0;

  while (pos < payload_stop) {
    // parse sub-block element ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // not a valid ID
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of sub-block group payload

    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvDiscardPadding) {
      status = UnserializeInt(pReader, pos, size, discard_padding);

      if (status < 0)  // error
        return status;
    }

    if (id != libwebm::kMkvBlock) {
      pos += size;  // consume sub-part of block group

      if (pos > payload_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    const long long block_stop = pos + size;

    if (block_stop > payload_stop)
      return E_FILE_FORMAT_INVALID;

    // parse track number

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long track = ReadUInt(pReader, pos, len);

    if (track < 0)  // error
      return static_cast<long>(track);

    if (track == 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume track number

    if ((pos + 2) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 2) > avail) {
      len = 2;
      return E_BUFFER_NOT_FULL;
    }

    pos += 2;  // consume timecode

    if ((pos + 1) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    unsigned char flags;

    status = pReader->Read(pos, 1, &flags);

    if (status < 0) {  // error or underflow
      len = 1;
      return status;
    }

    ++pos;  // consume flags byte
    assert(pos <= avail);

    if (pos >= block_stop)
      return E_FILE_FORMAT_INVALID;

    const int lacing = int(flags & 0x06) >> 1;

    if ((lacing != 0) && (block_stop > avail)) {
      len = static_cast<long>(block_stop - pos);
      return E_BUFFER_NOT_FULL;
    }

    pos = block_stop;  // consume block-part of block group
    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != payload_stop)
    return E_FILE_FORMAT_INVALID;

  status = CreateBlock(libwebm::kMkvBlockGroup, payload_start, payload_size,
                       discard_padding);
  if (status != 0)
    return status;

  m_pos = payload_stop;

  return 0;  // success
}